

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O2

void __thiscall lunasvg::Element::render(Element *this,Bitmap *bitmap,Matrix *matrix)

{
  SVGElement *pSVar1;
  shared_ptr<lunasvg::Canvas> canvas;
  __shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2> local_88;
  plutovg_matrix_t local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  plutovg_matrix_t local_48;
  undefined4 local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  if (((this->super_Node).m_node != (SVGNode *)0x0) &&
     (bitmap->m_surface != (plutovg_surface_t *)0x0)) {
    Canvas::create((Canvas *)&canvas,bitmap);
    Transform::Transform((Transform *)&local_70,matrix);
    std::__shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,&canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>);
    local_58 = 0;
    uStack_50 = 0;
    local_48.a = local_70.a;
    local_48.b = local_70.b;
    local_48.c = local_70.c;
    local_48.d = local_70.d;
    local_48.e = local_70.e;
    local_48.f = local_70.f;
    local_30 = 0;
    local_28 = local_88._M_ptr;
    a_Stack_20[0]._M_pi = local_88._M_refcount._M_pi;
    local_88._M_ptr = (element_type *)0x0;
    local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    pSVar1 = element(this,true);
    (*(pSVar1->super_SVGNode)._vptr_SVGNode[0x11])(pSVar1,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void Element::render(Bitmap& bitmap, const Matrix& matrix) const
{
    if(m_node == nullptr || bitmap.isNull())
        return;
    auto canvas = Canvas::create(bitmap);
    SVGRenderState state(nullptr, nullptr, matrix, SVGRenderMode::Painting, canvas);
    element(true)->render(state);
}